

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int coda_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  int iVar1;
  int local_2c;
  long lStack_28;
  int has_ascii_content;
  long dst_size_local;
  char *dst_local;
  coda_cursor *cursor_local;
  
  lStack_28 = dst_size;
  dst_size_local = (long)dst;
  dst_local = (char *)cursor;
  if (dst == (char *)0x0) {
    coda_set_error(-100,"dst argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xabb);
    cursor_local._4_4_ = -1;
  }
  else if (dst_size < 1) {
    coda_set_error(-100,"dst_size (%ld) argument is <= 0 (%s:%u)",dst_size,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                   ,0xac1);
    cursor_local._4_4_ = -1;
  }
  else {
    iVar1 = coda_cursor_has_ascii_content(cursor,&local_2c);
    if (iVar1 == 0) {
      if (local_2c == 0) {
        coda_set_error(-0x69,"cursor does not refer to text");
        cursor_local._4_4_ = -1;
      }
      else {
        cursor_local._4_4_ = read_string((coda_cursor *)dst_local,(char *)dst_size_local,lStack_28);
      }
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    int has_ascii_content;

    if (dst == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_size <= 0)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_size (%ld) argument is <= 0 (%s:%u)", dst_size, __FILE__,
                       __LINE__);
        return -1;
    }

    if (coda_cursor_has_ascii_content(cursor, &has_ascii_content) != 0)
    {
        return -1;
    }
    if (!has_ascii_content)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to text");
        return -1;
    }

    return read_string(cursor, dst, dst_size);
}